

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  int iVar8;
  Curl_easy *pCVar9;
  CURLMcode CVar10;
  ushort uVar11;
  pollfd *ufds;
  int iVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  uint local_58 [6];
  int *local_40;
  long local_38;
  
  CVar10 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    local_40 = ret;
    multi_timeout(multi,&local_38);
    iVar4 = timeout_ms;
    if (local_38 < timeout_ms) {
      iVar4 = (int)local_38;
    }
    if (local_38 < 0) {
      iVar4 = timeout_ms;
    }
    pCVar9 = multi->easyp;
    iVar12 = 0;
    if (pCVar9 != (Curl_easy *)0x0) {
      uVar7 = extraout_RDX;
      iVar12 = 0;
      do {
        uVar2 = multi_getsock(pCVar9,(curl_socket_t *)local_58,(int)uVar7);
        uVar5 = 0;
        do {
          if ((uVar2 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
            uVar7 = 0xffffffff;
          }
          else {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)local_58[uVar5];
          }
          if (((uVar2 >> ((byte)uVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)local_58[uVar5];
          }
        } while (((int)uVar7 != -1) &&
                (uVar7 = uVar5 + 1, bVar13 = uVar5 < 4, uVar5 = uVar7, bVar13));
        pCVar9 = pCVar9->next;
      } while (pCVar9 != (Curl_easy *)0x0);
    }
    uVar2 = 0;
    if (iVar12 + extra_nfds == 0 && extra_nfds == 0) {
      auVar14 = ZEXT416(extra_nfds) << 0x40;
    }
    else {
      auVar14 = (undefined1  [16])(*Curl_cmalloc)((ulong)(iVar12 + extra_nfds) << 3);
      if (auVar14._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    uVar7 = auVar14._8_8_;
    ufds = auVar14._0_8_;
    if ((iVar12 != 0) && (pCVar9 = multi->easyp, pCVar9 != (Curl_easy *)0x0)) {
      uVar5 = 0;
      do {
        uVar3 = multi_getsock(pCVar9,(curl_socket_t *)local_58,(int)uVar7);
        uVar6 = 0;
        do {
          if ((uVar3 >> ((uint)uVar6 & 0x1f) & 1) == 0) {
            uVar7 = 0xffffffff;
          }
          else {
            ufds[uVar5].fd = local_58[uVar6];
            ufds[uVar5].events = 1;
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar7 = (ulong)local_58[uVar6];
          }
          if (((uVar3 >> ((byte)uVar6 & 0x1f)) >> 0x10 & 1) != 0) {
            ufds[uVar5].fd = local_58[uVar6];
            ufds[uVar5].events = 4;
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar7 = (ulong)local_58[uVar6];
          }
          uVar2 = (uint)uVar5;
        } while (((int)uVar7 != -1) &&
                (uVar7 = uVar6 + 1, bVar13 = uVar6 < 4, uVar6 = uVar7, bVar13));
        pCVar9 = pCVar9->next;
      } while (pCVar9 != (Curl_easy *)0x0);
    }
    if (extra_nfds != 0) {
      uVar7 = 0;
      do {
        uVar3 = uVar2 + (int)uVar7;
        ufds[uVar3].fd = extra_fds[uVar7].fd;
        ufds[uVar3].events = 0;
        uVar11 = extra_fds[uVar7].events & 1;
        ufds[uVar3].events = uVar11;
        uVar1 = extra_fds[uVar7].events;
        if ((uVar1 & 2) != 0) {
          ufds[uVar3].events = uVar11 | 2;
        }
        if ((uVar1 & 4) != 0) {
          *(byte *)&ufds[uVar3].events = (byte)ufds[uVar3].events | 4;
        }
        uVar7 = uVar7 + 1;
      } while (extra_nfds != uVar7);
      uVar2 = uVar2 + (int)uVar7;
    }
    iVar8 = 0;
    if (uVar2 != 0) {
      iVar4 = Curl_poll(ufds,uVar2,iVar4);
      iVar8 = 0;
      if ((0 < iVar4) && (iVar8 = iVar4, extra_nfds != 0)) {
        uVar7 = 0;
        do {
          extra_fds[uVar7].revents = ufds[(uint)(iVar12 + (int)uVar7)].revents & 7;
          uVar7 = uVar7 + 1;
        } while (extra_nfds != uVar7);
      }
    }
    (*Curl_cfree)(ufds);
    CVar10 = CURLM_OK;
    if (local_40 != (int *)0x0) {
      *local_40 = iVar8;
      CVar10 = CURLM_OK;
    }
  }
  return CVar10;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;
  int retcode = 0;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);
    DEBUGF(infof(data, "Curl_poll(%d ds, %d ms) == %d\n",
                 nfds, timeout_ms, pollrc));

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}